

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O1

void __thiscall
OpenMD::Electrostatic::calcSurfaceTerm(Electrostatic *this,bool slabGeometry,int axis,RealType *pot)

{
  double *pdVar1;
  bool bVar2;
  pointer pEVar3;
  double dVar4;
  uint i;
  int iVar5;
  Molecule *pMVar6;
  long lVar7;
  long lVar8;
  undefined4 in_register_00000014;
  Atom *pAVar9;
  undefined7 in_register_00000031;
  pointer ppAVar10;
  double tmp;
  RealType RVar11;
  double dVar12;
  Vector<double,_3U> result;
  MoleculeIterator mi;
  Vector3d r;
  Vector3d D;
  Vector3d t;
  double local_128 [4];
  double local_108 [3];
  MoleculeIterator local_f0;
  double local_e8 [2];
  undefined8 local_d8;
  Vector3d local_c8;
  double local_a8 [4];
  double *local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  double local_78;
  double dStack_70;
  double local_68;
  undefined8 uStack_60;
  RealType local_50;
  double local_48 [3];
  
  local_78 = (double)CONCAT44(in_register_00000014,axis);
  local_68 = (double)CONCAT44(local_68._4_4_,(int)CONCAT71(in_register_00000031,slabGeometry));
  local_f0._M_node = (_Base_ptr)0x0;
  local_c8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_c8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_c8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_a8[2] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_48[2] = 0.0;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_d8 = 0.0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_88 = pot;
  if (this->initialized_ == false) {
    initialize(this);
  }
  pMVar6 = SimInfo::beginMolecule(this->info_,&local_f0);
  if (pMVar6 != (Molecule *)0x0) {
    do {
      ppAVar10 = (pMVar6->atoms_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      while( true ) {
        if (ppAVar10 ==
            (pMVar6->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pAVar9 = (Atom *)0x0;
        }
        else {
          pAVar9 = *ppAVar10;
        }
        if (pAVar9 == (Atom *)0x0) break;
        iVar5 = AtomType::getIdent(pAVar9->atomType_);
        pEVar3 = (this->ElectrostaticMap).
                 super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar5 = (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar5];
        bVar2 = pEVar3[iVar5].is_Dipole;
        if ((pEVar3[iVar5].is_Charge & 1U) != 0) {
          dVar12 = pEVar3[iVar5].fixedCharge;
          if ((pEVar3[iVar5].is_Fluctuating & 1U) != 0) {
            dVar12 = dVar12 + *(double *)
                               (*(long *)((long)&(((pAVar9->super_StuntDouble).snapshotMan_)->
                                                  currentSnapshot_->atomData).flucQPos.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start +
                                         (pAVar9->super_StuntDouble).storage_) +
                               (long)(pAVar9->super_StuntDouble).localIndex_ * 8);
          }
          lVar7 = *(long *)((long)&(((pAVar9->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (pAVar9->super_StuntDouble).storage_);
          lVar8 = (long)(pAVar9->super_StuntDouble).localIndex_;
          pdVar1 = (double *)(lVar7 + lVar8 * 0x18);
          local_c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
          local_c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
          local_c8.super_Vector<double,_3U>.data_[2] = *(double *)(lVar7 + 0x10 + lVar8 * 0x18);
          Snapshot::wrapVector(this->info_->sman_->currentSnapshot_,&local_c8);
          local_128[0] = 0.0;
          local_128[1] = 0.0;
          local_128[2] = 0.0;
          lVar7 = 0;
          do {
            local_128[lVar7] = local_c8.super_Vector<double,_3U>.data_[lVar7] * dVar12;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          lVar7 = 0;
          do {
            local_e8[lVar7] = local_128[lVar7] + local_e8[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
        }
        if ((bVar2 & 1U) != 0) {
          lVar8 = (long)(pAVar9->super_StuntDouble).localIndex_;
          lVar7 = *(long *)((long)&(((pAVar9->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).dipole.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (pAVar9->super_StuntDouble).storage_);
          local_108[2] = *(double *)(lVar7 + 0x10 + lVar8 * 0x18);
          pdVar1 = (double *)(lVar7 + lVar8 * 0x18);
          local_108[0] = *pdVar1;
          local_108[1] = pdVar1[1];
          local_128[0] = 0.0;
          local_128[1] = 0.0;
          local_128[2] = 0.0;
          lVar7 = 0;
          do {
            local_128[lVar7] = local_108[lVar7] * 0.20819434;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          local_a8[2] = local_128[2];
          local_a8[0] = local_128[0];
          local_a8[1] = local_128[1];
          lVar7 = 0;
          do {
            local_e8[lVar7] = local_a8[lVar7] + local_e8[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
        }
        ppAVar10 = ppAVar10 + 1;
      }
      pMVar6 = SimInfo::nextMolecule(this->info_,&local_f0);
    } while (pMVar6 != (Molecule *)0x0);
  }
  RVar11 = Snapshot::getVolume(this->info_->sman_->currentSnapshot_);
  if (local_68._0_1_ == '\0') {
    RVar11 = RVar11 * 3.0;
  }
  else {
    iVar5 = SUB84(local_78,0);
    local_e8[((iVar5 + 1) / 3) * -3 + iVar5 + 1] = 0.0;
    local_e8[((iVar5 + 2) / 3) * -3 + iVar5 + 2] = 0.0;
  }
  dVar12 = 0.0;
  lVar7 = 0;
  do {
    dVar12 = dVar12 + local_e8[lVar7] * local_e8[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  *local_88 = (6.283185307179586 / RVar11) * 332.0637778 * dVar12 + *local_88;
  pMVar6 = SimInfo::beginMolecule(this->info_,&local_f0);
  if (pMVar6 != (Molecule *)0x0) {
    dVar12 = (6.283185307179586 / RVar11) * -332.0637778;
    dVar12 = dVar12 + dVar12;
    local_88 = (double *)local_e8[1];
    uStack_80 = (undefined4)local_d8;
    uStack_7c = local_d8._4_4_;
    local_68 = local_e8[0];
    uStack_60 = 0;
    local_78 = local_d8;
    dStack_70 = local_e8[0];
    do {
      ppAVar10 = (pMVar6->atoms_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      while( true ) {
        if (ppAVar10 ==
            (pMVar6->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pAVar9 = (Atom *)0x0;
        }
        else {
          pAVar9 = *ppAVar10;
        }
        if (pAVar9 == (Atom *)0x0) break;
        local_108[0] = 0.0;
        local_108[1] = 0.0;
        local_108[2] = 0.0;
        lVar7 = 0;
        do {
          local_108[lVar7] = local_e8[lVar7] * dVar12;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        local_128[2] = local_108[2];
        local_128[0] = local_108[0];
        local_128[1] = local_108[1];
        lVar7 = (long)(pAVar9->super_StuntDouble).localIndex_ * 0x18 +
                *(long *)((long)&(((pAVar9->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                 atomData).electricField.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                         (pAVar9->super_StuntDouble).storage_);
        lVar8 = 0;
        do {
          *(double *)(lVar7 + lVar8 * 8) = local_128[lVar8] + *(double *)(lVar7 + lVar8 * 8);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        iVar5 = AtomType::getIdent(pAVar9->atomType_);
        pEVar3 = (this->ElectrostaticMap).
                 super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar5 = (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar5];
        bVar2 = pEVar3[iVar5].is_Dipole;
        if ((pEVar3[iVar5].is_Charge & 1U) != 0) {
          RVar11 = pEVar3[iVar5].fixedCharge;
          if ((pEVar3[iVar5].is_Fluctuating & 1U) != 0) {
            lVar7 = *(long *)((long)&(((pAVar9->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                     atomData).position.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                             (pAVar9->super_StuntDouble).storage_);
            lVar8 = (long)(pAVar9->super_StuntDouble).localIndex_;
            pdVar1 = (double *)(lVar7 + lVar8 * 0x18);
            local_c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
            local_c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
            local_c8.super_Vector<double,_3U>.data_[2] = *(double *)(lVar7 + 0x10 + lVar8 * 0x18);
            local_50 = pEVar3[iVar5].fixedCharge;
            Snapshot::wrapVector(this->info_->sman_->currentSnapshot_,&local_c8);
            dVar4 = 0.0;
            lVar7 = 0;
            do {
              dVar4 = dVar4 + local_c8.super_Vector<double,_3U>.data_[lVar7] * local_e8[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            lVar8 = (long)(pAVar9->super_StuntDouble).localIndex_;
            lVar7 = *(long *)((long)&(((pAVar9->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                     atomData).flucQFrc.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                             (pAVar9->super_StuntDouble).storage_);
            *(double *)(lVar7 + lVar8 * 8) = dVar4 * dVar12 + *(double *)(lVar7 + lVar8 * 8);
            RVar11 = local_50;
          }
          local_108[0] = 0.0;
          local_108[1] = 0.0;
          local_108[2] = 0.0;
          lVar7 = 0;
          do {
            local_108[lVar7] = local_e8[lVar7] * RVar11 * dVar12;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          local_128[2] = local_108[2];
          local_128[0] = local_108[0];
          local_128[1] = local_108[1];
          lVar7 = (long)(pAVar9->super_StuntDouble).localIndex_ * 0x18 +
                  *(long *)((long)&(((pAVar9->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).force.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (pAVar9->super_StuntDouble).storage_);
          lVar8 = 0;
          do {
            *(double *)(lVar7 + lVar8 * 8) = local_128[lVar8] + *(double *)(lVar7 + lVar8 * 8);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
        }
        if ((bVar2 & 1U) != 0) {
          lVar8 = (long)(pAVar9->super_StuntDouble).localIndex_;
          lVar7 = *(long *)((long)&(((pAVar9->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).dipole.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (pAVar9->super_StuntDouble).storage_);
          local_108[2] = (double)*(undefined8 *)(lVar7 + 0x10 + lVar8 * 0x18);
          pdVar1 = (double *)(lVar7 + lVar8 * 0x18);
          local_108[0] = *pdVar1;
          local_108[1] = pdVar1[1];
          local_128[0] = 0.0;
          local_128[1] = 0.0;
          local_128[2] = 0.0;
          lVar7 = 0;
          do {
            local_128[lVar7] = local_108[lVar7] * 0.20819434;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          local_a8[2] = local_128[2];
          local_a8[0] = local_128[0];
          local_a8[1] = local_128[1];
          local_108[0] = local_128[1] * local_78 - local_128[2] * (double)local_88;
          local_108[1] = local_128[2] * dStack_70 -
                         local_128[0] * (double)CONCAT44(uStack_7c,uStack_80);
          local_108[2] = local_128[0] * (double)local_88 - local_68 * local_128[1];
          local_128[0] = 0.0;
          local_128[1] = 0.0;
          local_128[2] = 0.0;
          lVar7 = 0;
          do {
            local_128[lVar7] = local_108[lVar7] * dVar12;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          local_48[2] = local_128[2];
          local_48[0] = local_128[0];
          local_48[1] = local_128[1];
          lVar7 = (long)(pAVar9->super_StuntDouble).localIndex_ * 0x18 +
                  *(long *)((long)&(((pAVar9->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).torque.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (pAVar9->super_StuntDouble).storage_);
          lVar8 = 0;
          do {
            *(double *)(lVar7 + lVar8 * 8) = local_48[lVar8] + *(double *)(lVar7 + lVar8 * 8);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
        }
        ppAVar10 = ppAVar10 + 1;
      }
      pMVar6 = SimInfo::nextMolecule(this->info_,&local_f0);
    } while (pMVar6 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void Electrostatic::calcSurfaceTerm(bool slabGeometry, int axis,
                                      RealType& pot) {
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    RealType C;
    Vector3d r;
    Vector3d D;
    Vector3d t;
    Vector3d netDipole(0.0);
    int atid;
    ElectrostaticAtomData data;

    const RealType mPoleConverter = 0.20819434;  // converts from the
                                                 // internal units of
                                                 // Debye (for dipoles)
                                                 // or Debye-angstroms
                                                 // (for quadrupoles) to
                                                 // electron angstroms or
                                                 // electron-angstroms^2

    const RealType eConverter = 332.0637778;  // convert the
                                              // Charge-Charge
                                              // electrostatic
                                              // interactions into kcal /
                                              // mol assuming distances
                                              // are measured in
                                              // angstroms.

    if (!initialized_) initialize();

    for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
         mol           = info_->nextMolecule(mi)) {
      for (Atom* atom = mol->beginAtom(ai); atom != NULL;
           atom       = mol->nextAtom(ai)) {
        atid = atom->getAtomType()->getIdent();
        data = ElectrostaticMap[Etids[atid]];

        if (data.is_Charge) {
          C = data.fixedCharge;
          if (data.is_Fluctuating) C += atom->getFlucQPos();

          r = atom->getPos();
          info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);

          netDipole += C * r;
        }

        if (data.is_Dipole) {
          D = atom->getDipole() * mPoleConverter;
          netDipole += D;
        }
      }
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, netDipole.getArrayPointer(), 3, MPI_REALTYPE,
                  MPI_SUM, MPI_COMM_WORLD);
#endif

    RealType V = info_->getSnapshotManager()->getCurrentSnapshot()->getVolume();
    RealType prefactor;

    if (slabGeometry) {
      prefactor = 2.0 * Constants::PI / V;
      // Compute complementary axes to the privileged axis
      int axis1        = (axis + 1) % 3;
      int axis2        = (axis + 2) % 3;
      netDipole[axis1] = 0.0;
      netDipole[axis2] = 0.0;
    } else {
      prefactor = 2.0 * Constants::PI / (3.0 * V);
    }

    pot += eConverter * prefactor * netDipole.lengthSquare();

    for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
         mol           = info_->nextMolecule(mi)) {
      for (Atom* atom = mol->beginAtom(ai); atom != NULL;
           atom       = mol->nextAtom(ai)) {
        atom->addElectricField(-eConverter * prefactor * 2.0 * netDipole);

        atid = atom->getAtomType()->getIdent();
        data = ElectrostaticMap[Etids[atid]];

        if (data.is_Charge) {
          C = data.fixedCharge;
          if (data.is_Fluctuating) {
            r = atom->getPos();
            info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);
            atom->addFlucQFrc(-eConverter * prefactor * 2.0 *
                              dot(r, netDipole));
          }
          atom->addFrc(-eConverter * prefactor * 2.0 * C * netDipole);
        }

        if (data.is_Dipole) {
          D = atom->getDipole() * mPoleConverter;
          t = -eConverter * prefactor * 2.0 * cross(D, netDipole);
          atom->addTrq(t);
        }
      }
    }
  }